

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

void __thiscall
helics::DelayFilterOperation::setString
          (DelayFilterOperation *this,string_view property,string_view val)

{
  bool bVar1;
  TimeRepresentation<count_time<9,_long>_> TVar2;
  string_view timeString;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view val_local;
  char *extraout_RDX;
  
  __y._M_str = "delay";
  __y._M_len = 5;
  bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property,__y);
  if (bVar1) {
    timeString._M_str = extraout_RDX;
    timeString._M_len = (size_t)val._M_str;
    TVar2 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                      ((utilities *)val._M_len,timeString);
    LOCK();
    (this->delay)._M_i.internalTimeCode = TVar2.internalTimeCode;
    UNLOCK();
  }
  return;
}

Assistant:

void DelayFilterOperation::setString(std::string_view property, std::string_view val)
{
    if (property == "delay") {
        try {
            delay = gmlc::utilities::loadTimeFromString<helics::Time>(val);
        }
        catch (const std::invalid_argument&) {
            throw(helics::InvalidParameter(std::string(val) + " is not a valid time string"));
        }
    }
}